

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O3

int inet_pton4(char *src,uchar *dst)

{
  char cVar1;
  bool bVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  bool bVar7;
  uchar tmp [4];
  undefined4 local_3c;
  uint *local_38;
  
  puVar6 = &local_3c;
  local_3c = local_3c & 0xffffff00;
  uVar4 = 0;
  local_38 = (uint *)dst;
  do {
    uVar5 = 0;
    bVar7 = false;
    while( true ) {
      cVar1 = *src;
      if (cVar1 == '\0') {
        if (uVar4 < 4) {
          return -0x16;
        }
        *local_38 = local_3c;
        return 0;
      }
      pvVar3 = memchr("0123456789",(int)cVar1,0xb);
      if (pvVar3 == (void *)0x0) break;
      if ((bool)(bVar7 & (char)uVar5 == '\0')) {
        return -0x16;
      }
      uVar5 = (int)pvVar3 + -0x59f85c + (uVar5 & 0xff) * 10;
      if (0xff < uVar5) {
        return -0x16;
      }
      src = src + 1;
      *(char *)puVar6 = (char)uVar5;
      bVar2 = !bVar7;
      bVar7 = true;
      if (bVar2) {
        bVar7 = uVar4 < 4;
        uVar4 = uVar4 + 1;
        if (uVar4 == 5) {
          return -0x16;
        }
      }
    }
    if (!(bool)(uVar4 != 4 & bVar7 & cVar1 == '.')) {
      return -0x16;
    }
    src = src + 1;
    *(undefined1 *)((long)puVar6 + 1) = 0;
    puVar6 = (undefined4 *)((long)puVar6 + 1);
  } while( true );
}

Assistant:

static int inet_pton4(const char *src, unsigned char *dst) {
  static const char digits[] = "0123456789";
  int saw_digit, octets, ch;
  unsigned char tmp[sizeof(struct in_addr)], *tp;

  saw_digit = 0;
  octets = 0;
  *(tp = tmp) = 0;
  while ((ch = *src++) != '\0') {
    const char *pch;

    if ((pch = strchr(digits, ch)) != NULL) {
      unsigned int nw = *tp * 10 + (pch - digits);

      if (saw_digit && *tp == 0)
        return UV_EINVAL;
      if (nw > 255)
        return UV_EINVAL;
      *tp = nw;
      if (!saw_digit) {
        if (++octets > 4)
          return UV_EINVAL;
        saw_digit = 1;
      }
    } else if (ch == '.' && saw_digit) {
      if (octets == 4)
        return UV_EINVAL;
      *++tp = 0;
      saw_digit = 0;
    } else
      return UV_EINVAL;
  }
  if (octets < 4)
    return UV_EINVAL;
  memcpy(dst, tmp, sizeof(struct in_addr));
  return 0;
}